

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_ImplicationExpr_Test::TestBody(ExprTest_ImplicationExpr_Test *this)

{
  bool bVar1;
  LogicalConstant condition_00;
  LogicalConstant then_expr_00;
  ExprFactory *this_00;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_80;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ExprBase local_48;
  AssertHelper local_40;
  LogicalConstant else_expr;
  LogicalConstant then_expr;
  LogicalConstant condition;
  
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  this_00 = &(this->super_ExprTest).factory_;
  condition_00 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,true);
  condition.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>)
       (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>)condition_00;
  then_expr_00 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,false);
  then_expr.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>)
       (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>)then_expr_00;
  else_expr = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,true);
  local_48.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>>::
               MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                         ((BasicExprFactory<std::allocator<char>> *)this_00,
                          (LogicalExpr)
                          condition_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                          super_ExprBase.impl_,
                          (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                          then_expr_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                          super_ExprBase.impl_,
                          (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                          else_expr.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                          super_ExprBase.impl_);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__1.success_ = (ExprBase)local_48.impl_ != (ExprBase)0x0;
  if ((ExprBase)local_48.impl_ == (ExprBase)0x0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"e != 0","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x1d1
               ,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  gtest_ar__1._0_4_ = 0x41;
  local_80.data_._0_4_ = (local_48.impl_)->kind_;
  testing::internal::CmpHelperEQ<mp::expr::Kind,mp::expr::Kind>
            ((internal *)&gtest_ar_,"expr::IMPLICATION","e.kind()",(Kind *)&gtest_ar__1,
             (Kind *)&local_80);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x1d2
               ,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1._0_8_ =
       mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>::
       condition((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                  *)&local_48);
  testing::internal::
  CmpHelperEQ<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((internal *)&gtest_ar_,"condition","e.condition()",&condition,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&gtest_ar__1);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x1d3
               ,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1._0_8_ =
       mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>::
       then_expr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                  *)&local_48);
  testing::internal::
  CmpHelperEQ<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((internal *)&gtest_ar_,"then_expr","e.then_expr()",&then_expr,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&gtest_ar__1);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x1d4
               ,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1._0_8_ =
       mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>::
       else_expr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
                  *)&local_48);
  testing::internal::
  CmpHelperEQ<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((internal *)&gtest_ar_,"else_expr","e.else_expr()",&else_expr,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&gtest_ar__1);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x1d5
               ,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::AssertionSuccess();
  if (gtest_ar__1.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"invalid argument",(allocator<char> *)&local_80);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>>::
      MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                ((BasicExprFactory<std::allocator<char>> *)this_00,(LogicalExpr)0x0,
                 (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                 then_expr.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                 impl_,(BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                       else_expr.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                       super_ExprBase.impl_);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar__1,
               (char (*) [148])
               "Expected: factory_.MakeImplication( LogicalExpr(), then_expr, else_expr) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (gtest_ar__1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x1d8,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  testing::AssertionSuccess();
  if (gtest_ar__1.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"invalid argument",(allocator<char> *)&local_80);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>>::
      MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                ((BasicExprFactory<std::allocator<char>> *)this_00,
                 (LogicalExpr)
                 condition.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                 impl_,(BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)0x0,
                 (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                 else_expr.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                 impl_);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar__1,
               (char (*) [148])
               "Expected: factory_.MakeImplication( condition, LogicalExpr(), else_expr) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (gtest_ar__1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x1db,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  mp::BasicExprFactory<std::allocator<char>>::
  MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((BasicExprFactory<std::allocator<char>> *)this_00,
             (LogicalExpr)
             condition.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
             then_expr.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, ImplicationExpr) {
  mp::ImplicationExpr e;
  (void)LogicalExpr(e);
  EXPECT_TRUE(e == 0);
  auto condition = factory_.MakeLogicalConstant(true);
  auto then_expr = factory_.MakeLogicalConstant(false);
  auto else_expr = factory_.MakeLogicalConstant(true);
  e = factory_.MakeImplication(condition, then_expr, else_expr);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::IMPLICATION, e.kind());
  EXPECT_EQ(condition, e.condition());
  EXPECT_EQ(then_expr, e.then_expr());
  EXPECT_EQ(else_expr, e.else_expr());
  EXPECT_ASSERT(factory_.MakeImplication(
                  LogicalExpr(), then_expr, else_expr),
                "invalid argument");
  EXPECT_ASSERT(factory_.MakeImplication(
                  condition, LogicalExpr(), else_expr),
                "invalid argument");
  factory_.MakeImplication(condition, then_expr, LogicalExpr());
}